

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O0

void debugDualChuzcFailNorms
               (HighsInt workCount,
               vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *workData,
               double *workDataNorm,HighsInt numVar,double *workDual,double *workDualNorm)

{
  const_reference pvVar1;
  int in_ECX;
  double *in_RDX;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_RSI;
  int in_EDI;
  long in_R8;
  double *in_R9;
  double dVar2;
  double value_1;
  HighsInt iVar;
  double value;
  HighsInt i;
  int local_44;
  int local_34;
  
  *in_RDX = 0.0;
  for (local_34 = 0; local_34 < in_EDI; local_34 = local_34 + 1) {
    pvVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
             operator[](in_RSI,(long)local_34);
    *in_RDX = pvVar1->second * pvVar1->second + *in_RDX;
  }
  dVar2 = sqrt(*in_RDX);
  *in_RDX = dVar2;
  *in_R9 = 0.0;
  for (local_44 = 0; local_44 < in_ECX; local_44 = local_44 + 1) {
    dVar2 = *(double *)(in_R8 + (long)local_44 * 8);
    *in_R9 = dVar2 * dVar2 + *in_R9;
  }
  dVar2 = sqrt(*in_R9);
  *in_R9 = dVar2;
  return;
}

Assistant:

void debugDualChuzcFailNorms(
    const HighsInt workCount,
    const std::vector<std::pair<HighsInt, double>>& workData,
    double& workDataNorm, const HighsInt numVar, const double* workDual,
    double& workDualNorm) {
  workDataNorm = 0;
  for (HighsInt i = 0; i < workCount; i++) {
    double value = workData[i].second;
    workDataNorm += value * value;
  }
  workDataNorm = sqrt(workDataNorm);
  workDualNorm = 0;
  for (HighsInt iVar = 0; iVar < numVar; iVar++) {
    double value = workDual[iVar];
    workDualNorm += value * value;
  }
  workDualNorm = sqrt(workDualNorm);
}